

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional1.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  Foo foo;
  function<void_(const_Foo_&,_int)> f_add_display;
  function<void_(int)> f_add_display3;
  function<void_(int)> f_add_display2;
  function<void_()> f_display_31337;
  function<void_(int)> f_display;
  function<void_(int)> f_display_obj;
  function<void_(int)> nullfun;
  function<void_()> f_display_42;
  undefined8 uStack_150;
  int local_140;
  char local_139;
  char local_138 [16];
  code *local_128;
  code *pcStack_120;
  code *local_118;
  undefined8 uStack_110;
  code *local_108;
  code *pcStack_100;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  char local_78 [16];
  code *local_68;
  code *local_60;
  char local_58 [16];
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  code *local_20;
  
  uStack_90 = 0;
  local_98 = print_num;
  pcStack_80 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  local_88 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  uStack_150 = (code *)0x1022ae;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-9);
  local_58[0] = 10;
  uStack_150 = (code *)0x1022c6;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_58,1);
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  uStack_150 = (code *)0x102308;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"HenryDbg::tp2----->",0x13);
  uStack_150 = (code *)0x10231c;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  uStack_150 = (code *)0x10232b;
  std::ostream::put('x');
  uStack_150 = (code *)0x102333;
  std::ostream::flush();
  local_38 = 0;
  uStack_30 = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iZhangHui[P]cplusplus-11/functional1.cpp:38:39)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iZhangHui[P]cplusplus-11/functional1.cpp:38:39)>
             ::_M_manager;
  uStack_150 = (code *)0x10236d;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2a);
  local_b8 = (undefined8 *)CONCAT71(local_b8._1_7_,10);
  uStack_150 = (code *)0x102385;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_b8,1);
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8 = (undefined8 *)0x0;
  uStack_b0 = 0;
  uStack_150 = (code *)0x1023a2;
  local_b8 = (undefined8 *)operator_new(0x10);
  *local_b8 = print_num;
  *(undefined4 *)(local_b8 + 1) = 0x7a69;
  pcStack_a0 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_invoke;
  local_a8 = std::_Function_handler<void_(),_std::_Bind<void_(*(int))(int)>_>::_M_manager;
  uStack_150 = (code *)0x1023e3;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x7a69);
  local_118 = (code *)CONCAT71(local_118._1_7_,10);
  uStack_150 = (code *)0x1023f8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_118,1);
  local_118 = Foo::print_add;
  uStack_110 = 0;
  pcStack_100 = std::_Function_handler<void_(const_Foo_&,_int),_void_(Foo::*)(int)_const>::_M_invoke
  ;
  local_108 = std::_Function_handler<void_(const_Foo_&,_int),_void_(Foo::*)(int)_const>::_M_manager;
  local_140 = 0x4cb2f;
  uStack_150 = (code *)0x10244b;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x4cb30);
  local_138[0] = 10;
  uStack_150 = (code *)0x102460;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_138,1);
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_138[4] = '\0';
  local_138[5] = '\0';
  local_138[6] = '\0';
  local_138[7] = '\0';
  local_138[8] = '\0';
  local_138[9] = '\0';
  local_138[10] = '\0';
  local_138[0xb] = '\0';
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  pcStack_120 = std::_Function_handler<int_(const_Foo_&),_int_Foo::*>::_M_invoke;
  local_128 = std::_Function_handler<int_(const_Foo_&),_int_Foo::*>::_M_manager;
  uStack_150 = (code *)0x10249d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"num_: ",6);
  if (local_128 == (code *)0x0) {
    uStack_150 = (code *)0x102723;
    uVar3 = std::__throw_bad_function_call();
    uStack_150 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iZhangHui[P]cplusplus-11/functional1.cpp:38:39)>
                 ::_M_invoke;
    uStack_150 = (code *)__clang_call_terminate(uVar3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2a);
    uStack_150 = (code *)CONCAT17(10,(undefined7)uStack_150);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_150 + 7),1);
    return (int)uStack_150;
  }
  uStack_150 = (code *)0x1024b9;
  iVar1 = (*pcStack_120)(local_138,&local_140);
  uStack_150 = (code *)0x1024c7;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  local_d8 = (undefined8 *)CONCAT71(local_d8._1_7_,10);
  uStack_150 = (code *)0x1024dc;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_d8,1);
  iVar1 = local_140;
  local_d8 = (undefined8 *)0x0;
  uStack_d0 = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  uStack_150 = (code *)0x1024fa;
  local_d8 = (undefined8 *)operator_new(0x18);
  *local_d8 = Foo::print_add;
  local_d8[1] = 0;
  *(int *)(local_d8 + 2) = iVar1;
  pcStack_c0 = std::
               _Function_handler<void_(int),_std::_Bind<void_(Foo::*(Foo,_std::_Placeholder<1>))(int)_const>_>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(int),_std::_Bind<void_(Foo::*(Foo,_std::_Placeholder<1>))(int)_const>_>
             ::_M_manager;
  uStack_150 = (code *)0x10253c;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1 + 2);
  local_f8 = (undefined8 *)CONCAT71(local_f8._1_7_,10);
  uStack_150 = (code *)0x102551;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_f8,1);
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8 = (undefined8 *)0x0;
  uStack_f0 = 0;
  uStack_150 = (code *)0x102568;
  local_f8 = (undefined8 *)operator_new(0x18);
  *local_f8 = Foo::print_add;
  local_f8[1] = 0;
  local_f8[2] = &local_140;
  pcStack_e0 = std::
               _Function_handler<void_(int),_std::_Bind<void_(Foo::*(const_Foo_*,_std::_Placeholder<1>))(int)_const>_>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(int),_std::_Bind<void_(Foo::*(const_Foo_*,_std::_Placeholder<1>))(int)_const>_>
             ::_M_manager;
  uStack_150 = (code *)0x1025a7;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_140 + 3);
  local_78[0] = 10;
  uStack_150 = (code *)0x1025bf;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_78,1);
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  local_60 = std::_Function_handler<void_(int),_PrintNum>::_M_invoke;
  local_68 = std::_Function_handler<void_(int),_PrintNum>::_M_manager;
  uStack_150 = (code *)0x1025f9;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x12);
  local_139 = '\n';
  uStack_150 = (code *)0x10260e;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_139,1);
  if (local_68 != (code *)0x0) {
    uStack_150 = (code *)0x10262d;
    (*local_68)(local_78,local_78,3);
  }
  if (local_e8 != (code *)0x0) {
    uStack_150 = (code *)0x102646;
    (*local_e8)(&local_f8,&local_f8,3);
  }
  if (local_c8 != (code *)0x0) {
    uStack_150 = (code *)0x102662;
    (*local_c8)(&local_d8,&local_d8,3);
  }
  if (local_128 != (code *)0x0) {
    uStack_150 = (code *)0x10267b;
    (*local_128)(local_138,local_138,3);
  }
  if (local_108 != (code *)0x0) {
    uStack_150 = (code *)0x102694;
    (*local_108)(&local_118,&local_118,3);
  }
  if (local_a8 != (code *)0x0) {
    uStack_150 = (code *)0x1026b3;
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if (local_28 != (code *)0x0) {
    uStack_150 = (code *)0x1026d2;
    (*local_28)(&local_38,&local_38,3);
  }
  if (local_48 != (code *)0x0) {
    uStack_150 = (code *)0x1026f1;
    (*local_48)(local_58,local_58,3);
  }
  if (local_88 != (code *)0x0) {
    uStack_150 = (code *)0x102710;
    (*local_88)(&local_98,&local_98,3);
  }
  return 0;
}

Assistant:

int main()
{
	// store a free function
	std::function<void(int)> f_display = print_num;
	f_display(-9);

	std::function<void(int)> nullfun;
	if (nullfun) {
		std::cout << "HenryDbg::tp1----->" << std::endl;

	} else {
		std::cout << "HenryDbg::tp2----->" << std::endl;
	}

	// store a lambda
	std::function<void()> f_display_42 = []() { print_num(42); };
	f_display_42();

	// store the result of a call to std::bind
	std::function<void()> f_display_31337 = std::bind(print_num, 31337);
	f_display_31337();

	// store a call to a member function
	std::function<void(const Foo&, int)> f_add_display = &Foo::print_add;
	const Foo foo(314159);
	f_add_display(foo, 1);

	// store a call to a data member accessor
	std::function<int(Foo const&)> f_num = &Foo::num_;
	std::cout << "num_: " << f_num(foo) << '\n';

	// store a call to a member function and object
	using std::placeholders::_1;
	std::function<void(int)> f_add_display2 = std::bind( &Foo::print_add, foo, _1 );
	f_add_display2(2);

	// store a call to a member function and object ptr
	std::function<void(int)> f_add_display3 = std::bind( &Foo::print_add, &foo, _1 );
	f_add_display3(3);

	// store a call to a function object
	std::function<void(int)> f_display_obj = PrintNum();
	f_display_obj(18);
}